

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::addCopyTests
               (TestCaseGroup *root,deUint32 srcFormat,deUint32 dstFormat)

{
  uint target;
  Context *pCVar1;
  bool bVar2;
  CompressedTexFormat CVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  TestNode *pTVar7;
  ulong *puVar8;
  size_type *psVar9;
  deUint32 internalFormat;
  uint *puVar10;
  undefined4 in_register_00000034;
  ulong uVar11;
  undefined8 uVar12;
  char *__s;
  long lVar13;
  string targetTestName;
  IVec3 targetSize;
  string groupName;
  IVec3 dstSize;
  IVec3 srcSize;
  allocator<char> local_109;
  ulong *local_108;
  long local_100;
  ulong local_f8;
  long lStack_f0;
  deUint32 local_e4;
  string local_e0;
  string local_c0;
  long local_a0;
  ulong local_98;
  long *local_90;
  undefined8 local_88;
  long local_80;
  undefined8 uStack_78;
  ulong local_70;
  ulong local_68;
  TestNode *local_60;
  TestCaseGroup *local_58;
  TestContext *local_50;
  undefined8 local_48;
  undefined4 local_40;
  pointer local_3c;
  undefined4 local_34;
  
  Functional::(anonymous_namespace)::formatToName_abi_cxx11_
            (&local_e0,(_anonymous_namespace_ *)CONCAT44(in_register_00000034,srcFormat),dstFormat);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_e0);
  local_108 = &local_f8;
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_f8 = *puVar8;
    lStack_f0 = plVar5[3];
  }
  else {
    local_f8 = *puVar8;
    local_108 = (ulong *)*plVar5;
  }
  local_100 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  Functional::(anonymous_namespace)::formatToName_abi_cxx11_
            (&local_c0,(_anonymous_namespace_ *)(ulong)dstFormat,(deUint32)local_100);
  uVar11 = 0xf;
  if (local_108 != &local_f8) {
    uVar11 = local_f8;
  }
  if (uVar11 < local_c0._M_string_length + local_100) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      uVar12 = local_c0.field_2._M_allocated_capacity;
    }
    if (local_c0._M_string_length + local_100 <= (ulong)uVar12) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_108);
      goto LAB_016886b4;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_c0._M_dataplus._M_p);
LAB_016886b4:
  local_90 = &local_80;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_80 = *plVar5;
    uStack_78 = puVar6[3];
  }
  else {
    local_80 = *plVar5;
    local_90 = (long *)*puVar6;
  }
  local_88 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,local_f8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_e4 = dstFormat;
  pTVar7 = (TestNode *)operator_new(0x78);
  pCVar1 = root->m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,pCVar1->m_testCtx,(char *)local_90,(char *)local_90);
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
  pTVar7[1]._vptr_TestNode = (_func_int **)pCVar1;
  local_60 = pTVar7;
  local_58 = root;
  tcu::TestNode::addChild((TestNode *)root,pTVar7);
  local_68 = (ulong)local_e4;
  local_70 = (ulong)srcFormat;
  lVar13 = 0;
  internalFormat = local_e4;
  do {
    local_98 = (ulong)(uint)(&DAT_01ccb550)[lVar13];
    bVar2 = glu::isCompressedFormat(srcFormat);
    local_a0 = lVar13;
    if ((lVar13 != 4 || !bVar2) && ((lVar13 != 4 || (bVar2 = isColorRenderable(srcFormat), bVar2))))
    {
      bVar2 = glu::isCompressedFormat(srcFormat);
      if (bVar2) {
        CVar3 = glu::mapGLCompressedTexFormat(srcFormat);
        lVar13 = local_a0;
        bVar2 = tcu::isAstcFormat(CVar3);
        if (((uint)lVar13 & 5) == 1 && !bVar2) goto LAB_01688bff;
      }
      local_50 = (TestContext *)((local_98 << 0x20) + local_70);
      puVar10 = &DAT_01ccb550;
      lVar13 = 0;
      do {
        target = *puVar10;
        bVar2 = glu::isCompressedFormat(internalFormat);
        if ((lVar13 != 4 || !bVar2) &&
           ((lVar13 != 4 || (bVar2 = isColorRenderable(internalFormat), bVar2)))) {
          bVar2 = glu::isCompressedFormat(internalFormat);
          if (bVar2) {
            CVar3 = glu::mapGLCompressedTexFormat(internalFormat);
            bVar2 = tcu::isAstcFormat(CVar3);
            if (((uint)lVar13 & 5) == 1 && !bVar2) goto LAB_01688bee;
          }
          iVar4 = (int)local_98;
          if (iVar4 < 0x8513) {
            if (iVar4 == 0xde1) {
              __s = "texture2d";
            }
            else if (iVar4 == 0x806f) {
              __s = "texture3d";
            }
            else {
LAB_01688930:
              __s = (char *)0x0;
            }
          }
          else if (iVar4 == 0x8513) {
            __s = "cubemap";
          }
          else if (iVar4 == 0x8c1a) {
            __s = "texture2d_array";
          }
          else {
            __s = "renderbuffer";
            if (iVar4 != 0x8d41) goto LAB_01688930;
          }
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,__s,&local_109);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_c0);
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          psVar9 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_e0.field_2._M_allocated_capacity = *psVar9;
            local_e0.field_2._8_8_ = plVar5[3];
          }
          else {
            local_e0.field_2._M_allocated_capacity = *psVar9;
            local_e0._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_e0._M_string_length = plVar5[1];
          *plVar5 = (long)psVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_e0);
          local_108 = &local_f8;
          puVar8 = (ulong *)(plVar5 + 2);
          if ((ulong *)*plVar5 == puVar8) {
            local_f8 = *puVar8;
            lStack_f0 = plVar5[3];
          }
          else {
            local_f8 = *puVar8;
            local_108 = (ulong *)*plVar5;
          }
          local_100 = plVar5[1];
          *plVar5 = (long)puVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          bVar2 = glu::isCompressedFormat(srcFormat);
          if ((bVar2) || (bVar2 = glu::isCompressedFormat(internalFormat), bVar2)) {
            local_e0._M_dataplus._M_p = (pointer)0x8000000080;
            local_e0._M_string_length = CONCAT44(local_e0._M_string_length._4_4_,0x10);
          }
          else {
            local_e0._M_dataplus._M_p = (pointer)0x4000000040;
            local_e0._M_string_length = CONCAT44(local_e0._M_string_length._4_4_,8);
          }
          getTestedSize((anon_unknown_0 *)&local_3c,(deUint32)local_98,srcFormat,(IVec3 *)&local_e0)
          ;
          getTestedSize((anon_unknown_0 *)&local_48,target,internalFormat,(IVec3 *)&local_e0);
          pTVar7 = (TestNode *)operator_new(0xb0);
          pCVar1 = local_58->m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar7,pCVar1->m_testCtx,(char *)local_108,(char *)local_108);
          pTVar7[1]._vptr_TestNode = (_func_int **)pCVar1;
          pTVar7->_vptr_TestNode = (_func_int **)&PTR__CopyImageTest_021ad2c0;
          pTVar7[1].m_testCtx = local_50;
          pTVar7[1].m_name._M_dataplus._M_p = local_3c;
          *(undefined4 *)&pTVar7[1].m_name._M_string_length = local_34;
          *(ulong *)((long)&pTVar7[1].m_name._M_string_length + 4) =
               ((ulong)target << 0x20) + local_68;
          *(undefined8 *)((long)&pTVar7[1].m_name.field_2 + 4) = local_48;
          *(undefined4 *)((long)&pTVar7[1].m_name.field_2 + 0xc) = local_40;
          *(undefined4 *)&pTVar7[1].m_description._M_dataplus._M_p = 0;
          pTVar7[1].m_description._M_string_length = 0;
          tcu::TestNode::addChild(local_60,pTVar7);
          internalFormat = local_e4;
          if (local_108 != &local_f8) {
            operator_delete(local_108,local_f8 + 1);
            internalFormat = local_e4;
          }
        }
LAB_01688bee:
        lVar13 = lVar13 + 1;
        puVar10 = puVar10 + 1;
      } while (lVar13 != 5);
    }
LAB_01688bff:
    lVar13 = local_a0 + 1;
    if (lVar13 == 5) {
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void addCopyTests (TestCaseGroup* root, deUint32 srcFormat, deUint32 dstFormat)
{
	const string			groupName	= string(formatToName(srcFormat)) + "_" + formatToName(dstFormat);
	TestCaseGroup* const	group		= new TestCaseGroup(root->getContext(), groupName.c_str(), groupName.c_str());

	const deUint32 targets[] =
	{
		GL_TEXTURE_2D,
		GL_TEXTURE_3D,
		GL_TEXTURE_CUBE_MAP,
		GL_TEXTURE_2D_ARRAY,
		GL_RENDERBUFFER
	};

	root->addChild(group);

	for (int srcTargetNdx = 0; srcTargetNdx < DE_LENGTH_OF_ARRAY(targets); srcTargetNdx++)
	{
		const deUint32	srcTarget				= targets[srcTargetNdx];
		const bool		srcIs3D					= srcTarget == GL_TEXTURE_2D_ARRAY || srcTarget == GL_TEXTURE_3D;

		if (glu::isCompressedFormat(srcFormat) && srcTarget == GL_RENDERBUFFER)
			continue;

		if (srcTarget == GL_RENDERBUFFER && !isColorRenderable(srcFormat))
			continue;

		if (glu::isCompressedFormat(srcFormat) && !tcu::isAstcFormat(glu::mapGLCompressedTexFormat(srcFormat)) && srcIs3D)
			continue;

		for (int dstTargetNdx = 0; dstTargetNdx < DE_LENGTH_OF_ARRAY(targets); dstTargetNdx++)
		{
			const deUint32	dstTarget				= targets[dstTargetNdx];
			const bool		dstIs3D					= dstTarget == GL_TEXTURE_2D_ARRAY || dstTarget == GL_TEXTURE_3D;

			if (glu::isCompressedFormat(dstFormat) && dstTarget == GL_RENDERBUFFER)
				continue;

			if (dstTarget == GL_RENDERBUFFER && !isColorRenderable(dstFormat))
				continue;

			if (glu::isCompressedFormat(dstFormat) && !tcu::isAstcFormat(glu::mapGLCompressedTexFormat(dstFormat)) && dstIs3D)
				continue;

			const string	targetTestName	= string(targetToName(srcTarget)) + "_to_" + targetToName(dstTarget);

			// Compressed formats require more space to fit all block size combinations.
			const bool		isCompressedCase	= glu::isCompressedFormat(srcFormat) || glu::isCompressedFormat(dstFormat);
			const IVec3		targetSize			= isCompressedCase ? IVec3(128, 128, 16) : IVec3(64, 64, 8);
			const IVec3		srcSize				= getTestedSize(srcTarget, srcFormat, targetSize);
			const IVec3		dstSize				= getTestedSize(dstTarget, dstFormat, targetSize);

			group->addChild(new CopyImageTest(root->getContext(),
											ImageInfo(srcFormat, srcTarget, srcSize),
											ImageInfo(dstFormat, dstTarget, dstSize),
											targetTestName.c_str(), targetTestName.c_str()));
		}
	}
}